

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

char * fmt::v5::internal::
       parse_arg_id<char,fmt::v5::internal::precision_adapter<fmt::v5::internal::dynamic_specs_handler<fmt::v5::basic_parse_context<char,fmt::v5::internal::error_handler>>&,char>>
                 (char *begin,char *end,
                 precision_adapter<fmt::v5::internal::dynamic_specs_handler<fmt::v5::basic_parse_context<char,_fmt::v5::internal::error_handler>_>_&,_char>
                 *handler)

{
  char cVar1;
  basic_string_view<char> id;
  bool bVar2;
  type count;
  precision_adapter<fmt::v5::internal::dynamic_specs_handler<fmt::v5::basic_parse_context<char,_fmt::v5::internal::error_handler>_>_&,_char>
  *in_RDX;
  char *in_RSI;
  char *in_RDI;
  char *it;
  uint index;
  char c;
  char *in_stack_ffffffffffffffa8;
  precision_adapter<fmt::v5::internal::dynamic_specs_handler<fmt::v5::basic_parse_context<char,_fmt::v5::internal::error_handler>_>_&,_char>
  *in_stack_ffffffffffffffb0;
  undefined5 in_stack_ffffffffffffffb8;
  undefined1 in_stack_ffffffffffffffbd;
  undefined1 in_stack_ffffffffffffffbe;
  undefined1 in_stack_ffffffffffffffbf;
  undefined1 uVar3;
  char *in_stack_ffffffffffffffc0;
  char **in_stack_ffffffffffffffc8;
  char *local_30;
  char *local_8;
  
  cVar1 = *in_RDI;
  local_8 = in_RDI;
  if ((cVar1 == '}') || (cVar1 == ':')) {
    precision_adapter<fmt::v5::internal::dynamic_specs_handler<fmt::v5::basic_parse_context<char,_fmt::v5::internal::error_handler>_>_&,_char>
    ::operator()(in_stack_ffffffffffffffb0);
  }
  else if ((cVar1 < '0') || ('9' < cVar1)) {
    bVar2 = is_name_start<char>(cVar1);
    local_30 = in_RDI;
    if (bVar2) {
      do {
        local_30 = local_30 + 1;
        uVar3 = false;
        if (local_30 != in_RSI) {
          cVar1 = *local_30;
          bVar2 = is_name_start<char>(cVar1);
          in_stack_ffffffffffffffbe = true;
          uVar3 = true;
          if (!bVar2) {
            in_stack_ffffffffffffffbd = '/' < cVar1 && cVar1 < ':';
            in_stack_ffffffffffffffbe = in_stack_ffffffffffffffbd;
            uVar3 = in_stack_ffffffffffffffbd;
          }
        }
      } while ((bool)uVar3 != false);
      count = to_unsigned<long>((long)local_30 - (long)in_RDI);
      basic_string_view<char>::basic_string_view
                ((basic_string_view<char> *)&stack0xffffffffffffffc0,in_RDI,count);
      id.data_._5_1_ = in_stack_ffffffffffffffbd;
      id.data_._0_5_ = in_stack_ffffffffffffffb8;
      id.data_._6_1_ = in_stack_ffffffffffffffbe;
      id.data_._7_1_ = uVar3;
      id.size_ = (size_t)in_stack_ffffffffffffffc0;
      precision_adapter<fmt::v5::internal::dynamic_specs_handler<fmt::v5::basic_parse_context<char,_fmt::v5::internal::error_handler>_>_&,_char>
      ::operator()(in_RDX,id);
      local_8 = local_30;
    }
    else {
      precision_adapter<fmt::v5::internal::dynamic_specs_handler<fmt::v5::basic_parse_context<char,_fmt::v5::internal::error_handler>_>_&,_char>
      ::on_error(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
    }
  }
  else {
    parse_nonnegative_int<char,fmt::v5::internal::precision_adapter<fmt::v5::internal::dynamic_specs_handler<fmt::v5::basic_parse_context<char,fmt::v5::internal::error_handler>>&,char>&>
              (in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0,
               (precision_adapter<fmt::v5::internal::dynamic_specs_handler<fmt::v5::basic_parse_context<char,_fmt::v5::internal::error_handler>_>_&,_char>
                *)CONCAT17(in_stack_ffffffffffffffbf,
                           CONCAT16(in_stack_ffffffffffffffbe,
                                    CONCAT15(in_stack_ffffffffffffffbd,in_stack_ffffffffffffffb8))))
    ;
    if ((in_RDI == in_RSI) || ((*in_RDI != '}' && (*in_RDI != ':')))) {
      precision_adapter<fmt::v5::internal::dynamic_specs_handler<fmt::v5::basic_parse_context<char,_fmt::v5::internal::error_handler>_>_&,_char>
      ::on_error(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
    }
    else {
      precision_adapter<fmt::v5::internal::dynamic_specs_handler<fmt::v5::basic_parse_context<char,_fmt::v5::internal::error_handler>_>_&,_char>
      ::operator()(in_stack_ffffffffffffffb0,(uint)((ulong)in_stack_ffffffffffffffa8 >> 0x20));
    }
  }
  return local_8;
}

Assistant:

FMT_CONSTEXPR const Char *parse_arg_id(
    const Char *begin, const Char *end, IDHandler &&handler) {
  assert(begin != end);
  Char c = *begin;
  if (c == '}' || c == ':')
    return handler(), begin;
  if (c >= '0' && c <= '9') {
    unsigned index = parse_nonnegative_int(begin, end, handler);
    if (begin == end || (*begin != '}' && *begin != ':'))
      return handler.on_error("invalid format string"), begin;
    handler(index);
    return begin;
  }
  if (!is_name_start(c))
    return handler.on_error("invalid format string"), begin;
  auto it = begin;
  do {
    ++it;
  } while (it != end && (is_name_start(c = *it) || ('0' <= c && c <= '9')));
  handler(basic_string_view<Char>(begin, to_unsigned(it - begin)));
  return it;
}